

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O1

string * __thiscall
absl::lts_20240722::flags_internal::(anonymous_namespace)::NormalizeFilename_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view filename)

{
  byte bVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcVar6;
  
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)filename._M_str;
  sVar4 = filename._M_len;
  if (this != (void *)0x0) {
    pvVar5 = (void *)0x0;
    do {
      bVar1 = *(byte *)(sVar4 + (long)pvVar5);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)bVar1;
      if ((bVar1 != 0x5c) && (bVar1 != 0x2f)) goto LAB_00103651;
      pvVar5 = (void *)((long)pvVar5 + 1);
    } while (this != pvVar5);
  }
  pvVar5 = (void *)0xffffffffffffffff;
LAB_00103651:
  if (pvVar5 == (void *)0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "";
    pcVar6 = "";
  }
  else {
    pcVar6 = (char *)((long)pvVar5 + sVar4);
    paVar3 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
    pcVar2 = (char *)((long)this + sVar4);
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar6,pcVar2,paVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string NormalizeFilename(absl::string_view filename) {
  // Skip any leading slashes
  auto pos = filename.find_first_not_of("\\/");
  if (pos == absl::string_view::npos) return "";

  filename.remove_prefix(pos);
  return std::string(filename);
}